

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TessPrimitiveType primType,
          SpacingMode spacing,Winding winding,bool usePointMode)

{
  char *pcVar1;
  char *__rhs;
  bool *__rhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_108,&local_128,"layout (");
  if ((uint)this < 3) {
    pcVar1 = (char *)(&DAT_00a0b4b0)[(ulong)this & 0xffffffff];
  }
  else {
    pcVar1 = (char *)0x0;
  }
  std::operator+(&local_e8,&local_108,pcVar1);
  std::operator+(&local_c8,&local_e8,", ");
  if (primType < TESSPRIMITIVETYPE_LAST) {
    pcVar1 = (&PTR_anon_var_dwarf_16c532_00a0b4c8)[primType];
  }
  else {
    pcVar1 = (char *)0x0;
  }
  std::operator+(&local_a8,&local_c8,pcVar1);
  std::operator+(&local_88,&local_a8,", ");
  pcVar1 = (char *)0x0;
  if (spacing == SPACINGMODE_FRACTIONAL_ODD) {
    pcVar1 = "cw";
  }
  __rhs = "ccw";
  if (spacing != SPACINGMODE_EQUAL) {
    __rhs = pcVar1;
  }
  std::operator+(&local_68,&local_88,__rhs);
  __rhs_00 = SSBOArrayLengthTests::init::arraysSized + 1;
  if ((char)winding != '\0') {
    __rhs_00 = (bool *)0x826a31;
  }
  std::operator+(&local_48,&local_68,__rhs_00);
  std::operator+(__return_storage_ptr__,&local_48,") in;\n");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  return __return_storage_ptr__;
}

Assistant:

static inline string getTessellationEvaluationInLayoutString (TessPrimitiveType primType, SpacingMode spacing, Winding winding, bool usePointMode=false)
{
	return string() + "layout (" + getTessPrimitiveTypeShaderName(primType)
								 + ", " + getSpacingModeShaderName(spacing)
								 + ", " + getWindingShaderName(winding)
								 + (usePointMode ? ", point_mode" : "")
								 + ") in;\n";
}